

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_meshb_header(char *filename,REF_INT *version,REF_FILEPOS *key_pos)

{
  int iVar1;
  size_t sVar2;
  __off_t _Var3;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_FILEPOS end_position;
  REF_FILEPOS next_position;
  REF_FILEPOS position;
  uint local_38;
  REF_INT keyword_code;
  int int_version;
  int int_code;
  FILE *file;
  REF_FILEPOS *key_pos_local;
  REF_INT *version_local;
  char *filename_local;
  
  for (position._4_4_ = 0; (int)position._4_4_ < 0x9c; position._4_4_ = position._4_4_ + 1) {
    key_pos[(int)position._4_4_] = -1;
  }
  file = (FILE *)key_pos;
  key_pos_local = (REF_FILEPOS *)version;
  version_local = (REF_INT *)filename;
  _int_version = fopen(filename,"r");
  if (_int_version == (FILE *)0x0) {
    printf("unable to open %s\n",version_local);
  }
  if (_int_version == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x587,
           "ref_import_meshb_header","unable to open file");
    filename_local._4_4_ = 2;
  }
  else {
    sVar2 = fread(&keyword_code,4,1,_int_version);
    if (sVar2 == 1) {
      if ((long)keyword_code == 1) {
        sVar2 = fread(&local_38,4,1,_int_version);
        if (sVar2 == 1) {
          if (((int)local_38 < 1) || (4 < (int)local_38)) {
            printf("version %d not supported\n",(ulong)local_38);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x58e,"ref_import_meshb_header","version");
            filename_local._4_4_ = 1;
          }
          else {
            *(uint *)key_pos_local = local_38;
            end_position = ftello(_int_version);
            iVar1 = fseeko(_int_version,0,2);
            if ((long)iVar1 == 0) {
              _Var3 = ftello(_int_version);
              do {
                if (_Var3 < end_position || end_position == 0) {
                  fclose(_int_version);
                  return 0;
                }
                next_position = end_position;
                iVar1 = fseeko(_int_version,end_position,0);
                if ((long)iVar1 != 0) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x597,"ref_import_meshb_header","fseeko NEXT failed",0,(long)iVar1);
                  return 1;
                }
                sVar2 = fread((void *)((long)&position + 4),4,1,_int_version);
                if (sVar2 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x5a6,"ref_import_meshb_header","keyword code",1,sVar2);
                  return 1;
                }
                if (((int)position._4_4_ < 0) || (0x9b < (int)position._4_4_)) {
                  printf("ignoring keyword %d\n",(ulong)position._4_4_);
                }
                else {
                  *(REF_FILEPOS *)(&file->_flags + (long)(int)position._4_4_ * 2) = next_position;
                }
                filename_local._4_4_ =
                     meshb_pos((FILE *)_int_version,(REF_INT)*key_pos_local,&end_position);
              } while (filename_local._4_4_ == 0);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x5ac,"ref_import_meshb_header",(ulong)filename_local._4_4_,"pos");
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x593,"ref_import_meshb_header","fseeko END failed",0,(long)iVar1);
              filename_local._4_4_ = 1;
            }
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x58b,"ref_import_meshb_header","version",1,sVar2);
          filename_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x58a,"ref_import_meshb_header","code",1,(long)keyword_code);
        filename_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x589,"ref_import_meshb_header","code",1,sVar2);
      filename_local._4_4_ = 1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_header(const char *filename,
                                           REF_INT *version,
                                           REF_FILEPOS *key_pos) {
  FILE *file;
  int int_code, int_version;
  REF_INT keyword_code;
  REF_FILEPOS position, next_position, end_position;

  for (keyword_code = 0; keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD;
       keyword_code++)
    key_pos[keyword_code] = REF_EMPTY;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fread((unsigned char *)&int_code, 4, 1, file), "code");
  REIS(1, int_code, "code");
  REIS(1, fread((unsigned char *)&int_version, 4, 1, file), "version");
  if (int_version < 1 || 4 < int_version) {
    printf("version %d not supported\n", int_version);
    THROW("version");
  }
  *version = (REF_INT)int_version;

  next_position = ftello(file);
  REIS(0, fseeko(file, 0, SEEK_END), "fseeko END failed");
  end_position = ftello(file);
  while (next_position <= end_position && 0 != next_position) {
    position = next_position;
    REIS(0, fseeko(file, position, SEEK_SET), "fseeko NEXT failed");
    /*
#include <inttypes.h>
    , {
      printf("end_position = %jd\n", (intmax_t)end_position);
      printf("next_position = %jd\n", (intmax_t)next_position);
      for (keyword_code = 0; keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD;
           keyword_code++) {
        if (REF_EMPTY != key_pos[keyword_code]) {
          printf("key_pos[%d] = %jd\n", keyword_code,
                 (intmax_t)key_pos[keyword_code]);
        }
      }
    });
    */
    REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
    if (0 <= keyword_code && keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD) {
      key_pos[keyword_code] = position;
    } else {
      printf("ignoring keyword %d\n", keyword_code);
    }
    RSS(meshb_pos(file, *version, &next_position), "pos");
  }

  fclose(file);
  return REF_SUCCESS;
}